

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O3

pcp_server_state_e handle_version_negotiation(pcp_server_t *s)

{
  byte bVar1;
  __suseconds_t _Var2;
  byte bVar3;
  pcp_server_state_e pVar4;
  pcp_flow_t *ppVar5;
  undefined1 local_68 [20];
  anon_union_16_3_a3f0114d_for___in6_u aStack_54;
  uint32_t uStack_44;
  uint32_t auStack_40 [2];
  ulong local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  bVar3 = s->next_version;
  bVar1 = s->pcp_version;
  if (bVar3 == bVar1) {
    bVar3 = bVar3 - 1;
    s->next_version = bVar3;
  }
  if (bVar1 == 0) {
    pcp_logger(PCP_LOGLVL_WARN,
               "Version negotiation failed for PCP server %s. Disabling sending PCP messages to this server."
               ,s->pcp_server_paddr);
    pVar4 = pss_set_not_working;
  }
  else {
    pcp_logger(PCP_LOGLVL_INFO,"Version %d not supported by server %s. Trying version %d.",
               (ulong)bVar1,s->pcp_server_paddr,(ulong)bVar3);
    s->pcp_version = s->next_version;
    ppVar5 = s->ping_flow_msg;
    if (s->next_version == '\0') {
      if (ppVar5 != (pcp_flow_t *)0x0) {
        ppVar5->state = pfs_wait_for_server_init;
        (ppVar5->timeout).tv_sec = 0;
        (ppVar5->timeout).tv_usec = 0;
      }
      uStack_28 = 0;
      uStack_24 = 0;
      uStack_30 = 0;
      uStack_2c = 0;
      uStack_44 = 0;
      local_68._0_4_ = 0;
      local_68._4_4_ = (undefined4)*(undefined8 *)s->src_ip;
      local_68._8_4_ = (undefined4)((ulong)*(undefined8 *)s->src_ip >> 0x20);
      local_68._12_4_ = (undefined4)*(undefined8 *)(s->src_ip + 2);
      local_68._16_4_ = (undefined4)((ulong)*(undefined8 *)(s->src_ip + 2) >> 0x20);
      aStack_54.__u6_addr32[0] = (uint32_t)*(undefined8 *)s->pcp_ip;
      aStack_54.__u6_addr32[1] = (uint32_t)((ulong)*(undefined8 *)s->pcp_ip >> 0x20);
      aStack_54.__u6_addr32[2] = (uint32_t)*(undefined8 *)(s->pcp_ip + 2);
      aStack_54.__u6_addr32[3] = (uint32_t)((ulong)*(undefined8 *)(s->pcp_ip + 2) >> 0x20);
      local_38 = (ulong)(s->nonce).n[2];
      auStack_40 = *(uint32_t (*) [2])(s->nonce).n;
      ppVar5 = pcp_create_flow(s,(flow_key_data *)local_68);
      s->ping_flow_msg = ppVar5;
      pcp_db_add_flow(ppVar5);
      ppVar5 = s->ping_flow_msg;
    }
    if (ppVar5 == (pcp_flow_t *)0x0) {
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      local_68._0_8_ = s;
      pcp_db_foreach_flow(s->ctx,get_first_flow_iter,local_68);
      ppVar5 = (pcp_flow_t *)CONCAT44(local_68._12_4_,local_68._8_4_);
      s->ping_flow_msg = ppVar5;
      if (ppVar5 == (pcp_flow_t *)0x0) {
        (s->next_timeout).tv_sec = 0;
        (s->next_timeout).tv_usec = 0;
        return pss_ping;
      }
    }
    ppVar5->resend_timeout = 0;
    ppVar5->retry_count = 0;
    handle_flow_event(ppVar5,fev_send,(pcp_recv_msg_t *)0x0);
    pVar4 = pss_set_not_working;
    if (ppVar5->state != pfs_failed) {
      _Var2 = (ppVar5->timeout).tv_usec;
      (s->next_timeout).tv_sec = (ppVar5->timeout).tv_sec;
      (s->next_timeout).tv_usec = _Var2;
      pVar4 = pss_wait_ping_resp;
    }
  }
  return pVar4;
}

Assistant:

static pcp_server_state_e handle_version_negotiation(pcp_server_t *s) {
    pcp_flow_t *ping_msg;

    if (s->next_version == s->pcp_version) {
        s->next_version--;
    }

    if (s->pcp_version == 0
#if PCP_MIN_SUPPORTED_VERSION > 0
        || (s->next_version < PCP_MIN_SUPPORTED_VERSION)
#endif
    ) {
        PCP_LOG(PCP_LOGLVL_WARN,
                "Version negotiation failed for PCP server %s. "
                "Disabling sending PCP messages to this server.",
                s->pcp_server_paddr);

        return pss_set_not_working;
    }

    PCP_LOG(PCP_LOGLVL_INFO,
            "Version %d not supported by server %s. Trying version %d.",
            s->pcp_version, s->pcp_server_paddr, s->next_version);
    s->pcp_version = s->next_version;

    ping_msg = s->ping_flow_msg;

#ifndef PCP_DISABLE_NATPMP
    if (s->pcp_version == 0) {
        if (ping_msg) {
            ping_msg->state = pfs_wait_for_server_init;
            ping_msg->timeout.tv_sec = 0;
            ping_msg->timeout.tv_usec = 0;
        }
        ping_msg = create_natpmp_ann_msg(s);
    }
#endif

    if (!ping_msg) {
        ping_msg = get_ping_msg(s);
        if (!ping_msg) {
            s->next_timeout.tv_sec = 0;
            s->next_timeout.tv_usec = 0;
            return pss_ping;
        }
    }

    ping_msg->retry_count = 0;
    ping_msg->resend_timeout = 0;

    handle_flow_event(ping_msg, fev_send, NULL);
    if (ping_msg->state == pfs_failed) {
        return pss_set_not_working;
    }

    s->next_timeout = ping_msg->timeout;

    return pss_wait_ping_resp;
}